

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O1

int DBG_change_entrylevel(int new_level)

{
  FILE *__stream;
  int iVar1;
  uint __errnum;
  char *pcVar3;
  void *pvVar2;
  
  if (max_entry_level == 0) {
    iVar1 = 0;
  }
  else {
    pvVar2 = pthread_getspecific(entry_level_key);
    iVar1 = (int)pvVar2;
    if (new_level != -1) {
      __errnum = pthread_setspecific(entry_level_key,(void *)(long)new_level);
      __stream = _stderr;
      if (__errnum != 0) {
        pcVar3 = strerror(__errnum);
        fprintf(__stream,"ERROR : pthread_setspecific() failed error:%d (%s)\n",(ulong)__errnum,
                pcVar3);
      }
    }
  }
  return iVar1;
}

Assistant:

int DBG_change_entrylevel(int new_level)
{
    int old_level;
    int ret;

    if(0 == max_entry_level)
    {
        return 0;
    }
    old_level = PtrToInt(pthread_getspecific(entry_level_key));
    if(-1 != new_level)
    {
        if ((ret = pthread_setspecific(entry_level_key,(LPVOID)(IntToPtr(new_level)))) != 0)
        {
            fprintf(stderr, "ERROR : pthread_setspecific() failed "
                    "error:%d (%s)\n", ret, strerror(ret));
        }
    }
    return old_level;
}